

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O2

void ucnv_extWriteToU(UConverter *cnv,int32_t *cx,uint32_t value,UChar **target,UChar *targetLimit,
                     int32_t **offsets,int32_t srcIndex,UErrorCode *pErrorCode)

{
  if (value < 0x300000) {
    ucnv_toUWriteCodePoint_63(cnv,value - 0x1f0000,target,targetLimit,offsets,srcIndex,pErrorCode);
    return;
  }
  ucnv_toUWriteUChars_63
            (cnv,(UChar *)((long)cx + (ulong)(value & 0x3ffff) * 2 + (long)cx[3]),
             (value >> 0x12) - 0xc,target,targetLimit,offsets,srcIndex,pErrorCode);
  return;
}

Assistant:

static inline void
ucnv_extWriteToU(UConverter *cnv, const int32_t *cx,
                 uint32_t value,
                 UChar **target, const UChar *targetLimit,
                 int32_t **offsets, int32_t srcIndex,
                 UErrorCode *pErrorCode) {
    /* output the result */
    if(UCNV_EXT_TO_U_IS_CODE_POINT(value)) {
        /* output a single code point */
        ucnv_toUWriteCodePoint(
            cnv, UCNV_EXT_TO_U_GET_CODE_POINT(value),
            target, targetLimit,
            offsets, srcIndex,
            pErrorCode);
    } else {
        /* output a string - with correct data we have resultLength>0 */
        ucnv_toUWriteUChars(
            cnv,
            UCNV_EXT_ARRAY(cx, UCNV_EXT_TO_U_UCHARS_INDEX, UChar)+
                UCNV_EXT_TO_U_GET_INDEX(value),
            UCNV_EXT_TO_U_GET_LENGTH(value),
            target, targetLimit,
            offsets, srcIndex,
            pErrorCode);
    }
}